

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O3

Uint32 __thiscall
Diligent::SerializedPipelineStateImpl::GetPatchedShaderCount
          (SerializedPipelineStateImpl *this,ARCHIVE_DEVICE_DATA_FLAGS DeviceType)

{
  DeviceType DVar1;
  uint uVar2;
  char (*in_R8) [68];
  string msg;
  string local_38;
  
  if ((this->m_Status)._M_i != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              (&local_38,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",in_R8
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetPatchedShaderCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1cc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((DeviceType ^ DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) <=
      DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) {
    FormatString<char[41]>(&local_38,(char (*) [41])"Only single device data flag is expected");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetPatchedShaderCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1cd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  DVar1 = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
  local_38._M_dataplus._M_p =
       (pointer)(((long)(this->m_Data).Shaders._M_elems[DVar1].
                        super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_Data).Shaders._M_elems[DVar1].
                        super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&local_38);
  return uVar2;
}

Assistant:

Uint32 DILIGENT_CALL_TYPE SerializedPipelineStateImpl::GetPatchedShaderCount(ARCHIVE_DEVICE_DATA_FLAGS DeviceType) const
{
    DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
    DEV_CHECK_ERR(IsPowerOfTwo(DeviceType), "Only single device data flag is expected");
    const auto  Type    = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
    const auto& Shaders = m_Data.Shaders[static_cast<size_t>(Type)];
    return StaticCast<Uint32>(Shaders.size());
}